

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreply.cpp
# Opt level: O3

void QNetworkReply::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined8 *puVar2;
  code *UNRECOVERED_JUMPTABLE;
  InterfaceType *pIVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_20;
  void *local_18;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 4) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
LAB_00195736:
        *puVar2 = pIVar3;
        goto switchD_00195663_default;
      }
    }
    else if (_id == 6) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
        goto LAB_00195736;
      }
    }
    else if (_id == 7) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_00195736;
      }
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
    goto switchD_00195663_default;
  }
  if (_c == IndexOfMethod) {
    UNRECOVERED_JUMPTABLE = *_a[1];
    lVar1 = *(long *)((long)_a[1] + 8);
    if (UNRECOVERED_JUMPTABLE == socketStartedConnecting && lVar1 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (UNRECOVERED_JUMPTABLE == requestSent && lVar1 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (UNRECOVERED_JUMPTABLE == metaDataChanged && lVar1 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (UNRECOVERED_JUMPTABLE == finished && lVar1 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (UNRECOVERED_JUMPTABLE == errorOccurred && lVar1 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (UNRECOVERED_JUMPTABLE == encrypted && lVar1 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (UNRECOVERED_JUMPTABLE == sslErrors && lVar1 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (UNRECOVERED_JUMPTABLE == preSharedKeyAuthenticationRequired && lVar1 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (UNRECOVERED_JUMPTABLE == redirected && lVar1 == 0) {
      *(undefined4 *)*_a = 8;
    }
    else if (UNRECOVERED_JUMPTABLE == redirectAllowed && lVar1 == 0) {
      *(undefined4 *)*_a = 9;
    }
    else if (UNRECOVERED_JUMPTABLE == uploadProgress && lVar1 == 0) {
      *(undefined4 *)*_a = 10;
    }
    else if (UNRECOVERED_JUMPTABLE == downloadProgress && lVar1 == 0) {
      *(undefined4 *)*_a = 0xb;
    }
    goto switchD_00195663_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_00195663_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar4 = 0;
LAB_001958b4:
      QMetaObject::activate(_o,&staticMetaObject,iVar4,(void **)0x0);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar4 = 1;
      goto LAB_001958b4;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar4 = 2;
      goto LAB_001958b4;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar4 = 3;
      goto LAB_001958b4;
    }
    break;
  case 4:
    local_10 = &local_20;
    local_20 = CONCAT44(local_20._4_4_,*_a[1]);
    iVar4 = 4;
    goto LAB_00195950;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar4 = 5;
      goto LAB_001958b4;
    }
    break;
  case 6:
    local_10 = (undefined8 *)_a[1];
    iVar4 = 6;
    goto LAB_00195950;
  case 7:
    local_20 = *_a[1];
    local_10 = &local_20;
    iVar4 = 7;
    goto LAB_00195950;
  case 8:
    local_10 = (undefined8 *)_a[1];
    iVar4 = 8;
LAB_00195950:
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_18);
switchD_00195663_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar4 = 9;
      goto LAB_001958b4;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      uploadProgress((QNetworkReply *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      downloadProgress((QNetworkReply *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xc:
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0xf0);
    goto LAB_001958c9;
  case 0xd:
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0xf8);
LAB_001958c9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      (*UNRECOVERED_JUMPTABLE)();
      return;
    }
    break;
  default:
    goto switchD_00195663_default;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReply::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReply *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->socketStartedConnecting(); break;
        case 1: _t->requestSent(); break;
        case 2: _t->metaDataChanged(); break;
        case 3: _t->finished(); break;
        case 4: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 5: _t->encrypted(); break;
        case 6: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 7: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 8: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 9: _t->redirectAllowed(); break;
        case 10: _t->uploadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 11: _t->downloadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 12: _t->abort(); break;
        case 13: _t->ignoreSslErrors(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::socketStartedConnecting, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::requestSent, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::metaDataChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::finished, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(QNetworkReply::NetworkError )>(_a, &QNetworkReply::errorOccurred, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::encrypted, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(const QList<QSslError> & )>(_a, &QNetworkReply::sslErrors, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QNetworkReply::preSharedKeyAuthenticationRequired, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(const QUrl & )>(_a, &QNetworkReply::redirected, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::redirectAllowed, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(qint64 , qint64 )>(_a, &QNetworkReply::uploadProgress, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(qint64 , qint64 )>(_a, &QNetworkReply::downloadProgress, 11))
            return;
    }
}